

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON__UINT32 Internal_DoubleArrayDataCRC(ON__UINT32 current_remainder,size_t count,double *a)

{
  undefined1 uVar1;
  endian eVar2;
  double dVar3;
  double dVar4;
  char **local_48;
  double *a1;
  char c;
  char *byte_swap;
  double x;
  double *a_local;
  size_t count_local;
  ON__UINT32 current_remainder_local;
  
  x = (double)a;
  a_local = (double *)count;
  count_local._4_4_ = current_remainder;
  eVar2 = ON::Endian();
  if (eVar2 == big_endian) {
    local_48 = &byte_swap;
  }
  else {
    local_48 = (char **)0x0;
  }
  if ((x != 0.0) && (a_local != (double *)0x0)) {
    dVar3 = (double)((long)x + (long)a_local * 8);
    while ((ulong)x < (ulong)dVar3) {
      dVar4 = (double)((long)x + 8);
      byte_swap = *(char **)x;
      if (((double)byte_swap == 0.0) && (!NAN((double)byte_swap))) {
        byte_swap = (char *)0x0;
      }
      x = dVar4;
      if (local_48 != (char **)0x0) {
        uVar1 = *(undefined1 *)local_48;
        *(undefined1 *)local_48 = *(undefined1 *)((long)local_48 + 7);
        *(undefined1 *)((long)local_48 + 7) = uVar1;
        uVar1 = *(undefined1 *)((long)local_48 + 1);
        *(undefined1 *)((long)local_48 + 1) = *(undefined1 *)((long)local_48 + 6);
        *(undefined1 *)((long)local_48 + 6) = uVar1;
        uVar1 = *(undefined1 *)((long)local_48 + 2);
        *(undefined1 *)((long)local_48 + 2) = *(undefined1 *)((long)local_48 + 5);
        *(undefined1 *)((long)local_48 + 5) = uVar1;
        uVar1 = *(undefined1 *)((long)local_48 + 3);
        *(undefined1 *)((long)local_48 + 3) = *(undefined1 *)((long)local_48 + 4);
        *(undefined1 *)((long)local_48 + 4) = uVar1;
      }
      count_local._4_4_ = ON_CRC32(count_local._4_4_,8,&byte_swap);
    }
  }
  return count_local._4_4_;
}

Assistant:

static ON__UINT32 Internal_DoubleArrayDataCRC(
  ON__UINT32 current_remainder,
  size_t count,
  const double* a
)
{
  double x;
  char* byte_swap 
    = (ON::endian::big_endian == ON::Endian()) 
    ? ((char*)&x)
    : nullptr;
  char c;
  if (nullptr != a && count > 0)
  {
    const double* a1 = a + count;
    while (a < a1)
    {
      x = *a++;
      if (0.0 == x)
        x = 0.0; // change -0.0 into +0.0
      else if (false == (x == x))
        x = ON_DBL_QNAN; // change any nan into ON_DBL_QNAN.
      if (nullptr != byte_swap)
      {
        c = byte_swap[0]; byte_swap[0] = byte_swap[7]; byte_swap[7] = c;
        c = byte_swap[1]; byte_swap[1] = byte_swap[6]; byte_swap[6] = c;
        c = byte_swap[2]; byte_swap[2] = byte_swap[5]; byte_swap[5] = c;
        c = byte_swap[3]; byte_swap[3] = byte_swap[4]; byte_swap[4] = c;
      }
      current_remainder = ON_CRC32(current_remainder, sizeof(x), (const void*)&x);
    }
  }
  return current_remainder;
}